

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

void __thiscall wasm::Wasm2JSBuilder::addMemoryFuncs(Wasm2JSBuilder *this,Ref ast,Module *wasm)

{
  Value *this_00;
  pointer puVar1;
  Memory *pMVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  Ref ast_00;
  undefined8 *puVar6;
  Value *pVVar7;
  Ref this_01;
  Ref RVar8;
  char *in_RCX;
  void *pvVar9;
  Ref in_R8;
  IString name;
  IString key;
  IString op;
  undefined1 auVar10 [16];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Ref local_48;
  Ref memorySizeFunc;
  
  name.str._M_str = (char *)wasm;
  name.str._M_len = FUNCTION_TABLE;
  memorySizeFunc = ast;
  local_48 = cashew::ValueBuilder::makeFunction(WASM_MEMORY_SIZE,name);
  puVar6 = (undefined8 *)cashew::Ref::operator[]((uint)&local_48);
  uVar5 = cashew::LOAD;
  uVar4 = BUFFER;
  this_00 = (Value *)*puVar6;
  pvVar9 = (void *)0x18;
  pVVar7 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar7->type = Null;
  cashew::Value::free(pVVar7,pvVar9);
  pVVar7->type = String;
  local_58 = (undefined4)uVar4;
  uStack_54 = (undefined4)((ulong)uVar4 >> 0x20);
  uStack_50 = (undefined4)uVar5;
  uStack_4c = (undefined4)((ulong)uVar5 >> 0x20);
  *(undefined4 *)&pVVar7->field_1 = local_58;
  *(undefined4 *)((long)&pVVar7->field_1 + 4) = uStack_54;
  *(undefined4 *)((long)&pVVar7->field_1 + 8) = uStack_50;
  *(undefined4 *)((long)&pVVar7->field_1 + 0xc) = uStack_4c;
  auVar10 = ::wasm::IString::interned(10,"byteLength",0);
  key.str._M_len = auVar10._8_8_;
  key.str._M_str = in_RCX;
  this_01 = cashew::ValueBuilder::makeDot((ValueBuilder *)pVVar7,auVar10._0_8_,key);
  sVar3 = ABI::wasm2js::SCRATCH_STORE_F64;
  RVar8.inst = cashew::DIV.inst;
  pvVar9 = (void *)0x18;
  pVVar7 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
  pVVar7->type = Null;
  cashew::Value::free(pVVar7,pvVar9);
  ast_00 = memorySizeFunc;
  pVVar7->type = Number;
  (pVVar7->field_1).arr = (ArrayStorage *)0x40f0000000000000;
  op.str._M_str = (char *)pVVar7;
  op.str._M_len = sVar3;
  RVar8 = cashew::ValueBuilder::makeBinary(this_01.inst,RVar8,op,in_R8);
  RVar8.inst = (Value *)makeJsCoercion(RVar8,JS_INT);
  RVar8 = cashew::ValueBuilder::makeReturn(RVar8);
  cashew::Value::push_back(this_00,RVar8);
  RVar8 = ast_00;
  cashew::Value::push_back(ast_00.inst,local_48);
  puVar1 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar1 != (wasm->memories).
                 super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (pMVar2 = (puVar1->_M_t).
               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
               super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,
     (pMVar2->initial).addr < (pMVar2->max).addr)) {
    addMemoryGrowFunc((Wasm2JSBuilder *)RVar8.inst,ast_00,wasm);
  }
  return;
}

Assistant:

void Wasm2JSBuilder::addMemoryFuncs(Ref ast, Module* wasm) {
  Ref memorySizeFunc = ValueBuilder::makeFunction(WASM_MEMORY_SIZE);
  memorySizeFunc[3]->push_back(ValueBuilder::makeReturn(
    makeJsCoercion(ValueBuilder::makeBinary(
                     ValueBuilder::makeDot(ValueBuilder::makeName(BUFFER),
                                           IString("byteLength")),
                     DIV,
                     ValueBuilder::makeInt(Memory::kPageSize)),
                   JsType::JS_INT)));
  ast->push_back(memorySizeFunc);

  if (!wasm->memories.empty() &&
      wasm->memories[0]->max > wasm->memories[0]->initial) {
    addMemoryGrowFunc(ast, wasm);
  }
}